

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O1

void __thiscall gvr::ColoredMesh::loadPLY(ColoredMesh *this,PLYReader *ply)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t *psVar3;
  size_t *psVar4;
  bool bVar5;
  ColoredMesh *pCVar6;
  ply_type pVar7;
  ply_type pVar8;
  ply_type pVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  float _scale;
  UInt8Receiver cg;
  UInt8Receiver cr;
  FloatArrayReceiver ss;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver se;
  FloatArrayReceiver vx;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  TriangleReceiver tr;
  UInt8Receiver cb;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  FloatArrayReceiver sc;
  string local_3f0;
  string local_3d0;
  UInt8Receiver local_3b0;
  UInt8Receiver local_390;
  FloatArrayReceiver local_370;
  ColoredMesh *local_350;
  FloatArrayReceiver local_348;
  FloatArrayReceiver local_328;
  FloatArrayReceiver local_308;
  FloatArrayReceiver local_2e8;
  FloatArrayReceiver local_2c8;
  FloatArrayReceiver local_2a8;
  FloatArrayReceiver local_288;
  FloatArrayReceiver local_268;
  long local_248;
  PLYReceiver local_240;
  ColoredMesh *local_238;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  UInt8Receiver local_b0;
  FloatArrayReceiver local_90;
  FloatArrayReceiver local_70;
  FloatArrayReceiver local_50;
  
  psVar3 = &local_2a8.size;
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"vertex","");
  lVar10 = PLYReader::instancesOfElement(ply,(string *)&local_2a8);
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  Model::setOriginFromPLY((Model *)this,ply);
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"vertex","");
  local_268.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_268.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"scan_size","");
  pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_2a8,(string *)&local_268);
  uVar11 = 1;
  if (pVar7 == ply_none) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"vertex","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"scan_error","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_d0,&local_f0);
    if (pVar8 != ply_none) goto LAB_0011e687;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"vertex","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"scan_conf","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_110,&local_130);
    uVar11 = (ulong)(pVar8 != ply_none);
    bVar12 = true;
  }
  else {
LAB_0011e687:
    bVar12 = false;
  }
  local_288.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_288.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"vertex","");
  local_370.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_370.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"sx","");
  local_350 = this;
  local_248 = lVar10;
  pVar8 = PLYReader::getTypeOfProperty(ply,(string *)&local_288,(string *)&local_370);
  if (pVar8 == ply_none) {
LAB_0011e7ff:
    bVar5 = false;
  }
  else {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"vertex","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"sy","");
    pVar9 = PLYReader::getTypeOfProperty(ply,&local_150,&local_170);
    if (pVar9 == ply_none) goto LAB_0011e7ff;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"vertex","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"sz","");
    PLYReader::getTypeOfProperty(ply,&local_190,&local_1b0);
    bVar5 = true;
  }
  (*(local_350->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(local_350,local_248,uVar11)
  ;
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
  }
  if (pVar8 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
  }
  if (local_370.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_370.size) {
    operator_delete(local_370.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_288.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_288.size) {
    operator_delete(local_288.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (bVar12) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  if (pVar7 == ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (local_268.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_268.size) {
    operator_delete(local_268.super_PLYReceiver._vptr_PLYReceiver);
  }
  pCVar6 = local_350;
  psVar3 = &local_370.size;
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_2a8.size) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2a8,(pCVar6->super_Mesh).super_PointCloud.vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_268,(pCVar6->super_Mesh).super_PointCloud.vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_288,(pCVar6->super_Mesh).super_PointCloud.vertex,3,2);
  local_370.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"vertex","");
  psVar4 = &local_2c8.size;
  local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"x","");
  PLYReader::setReceiver(ply,(string *)&local_370,(string *)&local_2c8,&local_2a8.super_PLYReceiver)
  ;
  if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_370.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_370.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_370.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"vertex","");
  local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"y","");
  PLYReader::setReceiver(ply,(string *)&local_370,(string *)&local_2c8,&local_268.super_PLYReceiver)
  ;
  if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_370.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_370.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_370.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"vertex","");
  local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"z","");
  PLYReader::setReceiver(ply,(string *)&local_370,(string *)&local_2c8,&local_288.super_PLYReceiver)
  ;
  if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_370.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_370.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_370,(pCVar6->super_Mesh).super_PointCloud.scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2c8,(pCVar6->super_Mesh).super_PointCloud.scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_50,(pCVar6->super_Mesh).super_PointCloud.scanprop,3,2);
  if ((pCVar6->super_Mesh).super_PointCloud.scanprop != (float *)0x0) {
    psVar3 = &local_2e8.size;
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"vertex","");
    psVar4 = &local_308.size;
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"scan_size","");
    PLYReader::setReceiver
              (ply,(string *)&local_2e8,(string *)&local_308,&local_370.super_PLYReceiver);
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"vertex","");
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"scan_error","");
    PLYReader::setReceiver
              (ply,(string *)&local_2e8,(string *)&local_308,&local_2c8.super_PLYReceiver);
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"vertex","");
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"scan_conf","");
    PLYReader::setReceiver
              (ply,(string *)&local_2e8,(string *)&local_308,&local_50.super_PLYReceiver);
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2e8,(pCVar6->super_Mesh).super_PointCloud.scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_308,(pCVar6->super_Mesh).super_PointCloud.scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_70,(pCVar6->super_Mesh).super_PointCloud.scanpos,3,2);
  if ((pCVar6->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    psVar3 = &local_328.size;
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"vertex","");
    psVar4 = &local_348.size;
    local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"sx","");
    PLYReader::setReceiver
              (ply,(string *)&local_328,(string *)&local_348,&local_2e8.super_PLYReceiver);
    if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"vertex","");
    local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"sy","");
    PLYReader::setReceiver
              (ply,(string *)&local_328,(string *)&local_348,&local_308.super_PLYReceiver);
    if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"vertex","");
    local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"sz","");
    PLYReader::setReceiver
              (ply,(string *)&local_328,(string *)&local_348,&local_70.super_PLYReceiver);
    if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_328,(pCVar6->super_Mesh).normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_348,(pCVar6->super_Mesh).normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_90,(pCVar6->super_Mesh).normal,3,2);
  psVar4 = &local_390.offset;
  local_390.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  psVar3 = &local_3b0.offset;
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"nx","");
  PLYReader::setReceiver(ply,(string *)&local_390,(string *)&local_3b0,&local_328.super_PLYReceiver)
  ;
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_390.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"ny","");
  PLYReader::setReceiver(ply,(string *)&local_390,(string *)&local_3b0,&local_348.super_PLYReceiver)
  ;
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_390.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"nz","");
  PLYReader::setReceiver(ply,(string *)&local_390,(string *)&local_3b0,&local_90.super_PLYReceiver);
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_390.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"diffuse_red","");
  pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_390,(string *)&local_3b0);
  if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (pVar7 == ply_none) {
    local_390.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
    local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"red","");
    pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_390,(string *)&local_3b0);
    if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  if (pVar7 == ply_none) {
    local_390.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
    local_3b0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"r","");
    pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_390,(string *)&local_3b0);
    if (local_3b0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_3b0.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_390.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_390.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  if (pVar7 - ply_float32 < 2) {
    _scale = 255.0;
  }
  else {
    _scale = *(float *)(&DAT_00128960 + (ulong)(pVar7 == ply_uint16) * 4);
  }
  UInt8Receiver::UInt8Receiver(&local_390,pCVar6->rgb,0,_scale);
  UInt8Receiver::UInt8Receiver(&local_3b0,pCVar6->rgb,1,_scale);
  UInt8Receiver::UInt8Receiver(&local_b0,pCVar6->rgb,2,_scale);
  paVar1 = &local_3f0.field_2;
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  paVar2 = &local_3d0.field_2;
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"diffuse_red","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_390.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"diffuse_green","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_3b0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"diffuse_blue","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_b0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"red","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_390.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"green","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_3b0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"blue","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_b0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"r","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_390.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"g","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_3b0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"b","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_b0.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"face","");
  uVar11 = PLYReader::instancesOfElement(ply,&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  pCVar6 = local_350;
  (*(local_350->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])
            (local_350,uVar11 & 0xffffffff);
  local_240._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00131998;
  local_238 = pCVar6;
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"face","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"vertex_index","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"face","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"vertex_indices","");
  PLYReader::setReceiver(ply,&local_3f0,&local_3d0,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  PLYReader::readData(ply);
  local_3f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"vertex","");
  local_3d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"nx","");
  pVar7 = PLYReader::getTypeOfProperty(ply,&local_3f0,&local_3d0);
  bVar12 = true;
  if (pVar7 != ply_none) {
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"vertex","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"ny","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_1d0,&local_210);
    if (pVar8 != ply_none) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vertex","");
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"nz","");
      pVar8 = PLYReader::getTypeOfProperty(ply,&local_230,&local_1f0);
      bVar12 = pVar8 == ply_none;
      bVar5 = true;
      goto LAB_0011f8f4;
    }
  }
  bVar5 = false;
LAB_0011f8f4:
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
  }
  if (pVar7 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  pCVar6 = local_350;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if (bVar12) {
    Mesh::recalculateNormals(&pCVar6->super_Mesh);
  }
  else {
    Mesh::normalizeNormals(&pCVar6->super_Mesh);
  }
  return;
}

Assistant:

void ColoredMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  float scale=1.0f;
  ply_type type=ply.getTypeOfProperty("vertex", "diffuse_red");

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "red");
  }

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "r");
  }

  if (type == ply_uint16)
  {
    scale=1.0f/256;
  }

  if (type == ply_float32 || type == ply_float64)
  {
    scale=255;
  }

  UInt8Receiver cr(getColorArray(), 0, scale), cg(getColorArray(), 1, scale), cb(getColorArray(), 2,
      scale);

  ply.setReceiver("vertex", "diffuse_red", &cr);
  ply.setReceiver("vertex", "diffuse_green", &cg);
  ply.setReceiver("vertex", "diffuse_blue", &cb);

  ply.setReceiver("vertex", "red", &cr);
  ply.setReceiver("vertex", "green", &cg);
  ply.setReceiver("vertex", "blue", &cb);

  ply.setReceiver("vertex", "r", &cr);
  ply.setReceiver("vertex", "g", &cg);
  ply.setReceiver("vertex", "b", &cb);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}